

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

DotMemberClauseSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DotMemberClauseSyntax,slang::parsing::Token&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,Token *args_1)

{
  Token dot;
  Token member;
  DotMemberClauseSyntax *this_00;
  Token *args_local_1;
  Token *args_local;
  BumpAllocator *this_local;
  
  this_00 = (DotMemberClauseSyntax *)allocate(this,0x30,8);
  dot.kind = args->kind;
  dot._2_1_ = args->field_0x2;
  dot.numFlags.raw = (args->numFlags).raw;
  dot.rawLen = args->rawLen;
  dot.info = args->info;
  member.kind = args_1->kind;
  member._2_1_ = args_1->field_0x2;
  member.numFlags.raw = (args_1->numFlags).raw;
  member.rawLen = args_1->rawLen;
  member.info = args_1->info;
  slang::syntax::DotMemberClauseSyntax::DotMemberClauseSyntax(this_00,dot,member);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }